

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_socket(Curl_multi *multi,curl_socket_t s,int *running_handles)

{
  CURLMcode result;
  int *running_handles_local;
  curl_socket_t s_local;
  Curl_multi *multi_local;
  
  if ((multi->in_callback & 1U) == 0) {
    multi_local._4_4_ = multi_socket(multi,false,s,0,running_handles);
    if (multi_local._4_4_ < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_socket(struct Curl_multi *multi, curl_socket_t s,
                            int *running_handles)
{
  CURLMcode result;
  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;
  result = multi_socket(multi, FALSE, s, 0, running_handles);
  if(CURLM_OK >= result)
    update_timer(multi);
  return result;
}